

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::GetVariable(ShaderVariableManagerGL *this,Uint32 Index)

{
  Uint32 UVar1;
  IShaderResourceVariable *pSSBO;
  IShaderResourceVariable *pImage;
  IShaderResourceVariable *pTexture;
  IShaderResourceVariable *pUB;
  ShaderVariableLocator VarLocator;
  Uint32 Index_local;
  ShaderVariableManagerGL *this_local;
  
  VarLocator._12_4_ = Index;
  ShaderVariableLocator::ShaderVariableLocator((ShaderVariableLocator *)&pUB,this,Index);
  UVar1 = GetNumUBs(this);
  this_local = (ShaderVariableManagerGL *)
               ShaderVariableLocator::
               TryResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
                         ((ShaderVariableLocator *)&pUB,UVar1);
  if (this_local == (ShaderVariableManagerGL *)0x0) {
    UVar1 = GetNumTextures(this);
    this_local = (ShaderVariableManagerGL *)
                 ShaderVariableLocator::
                 TryResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                           ((ShaderVariableLocator *)&pUB,UVar1);
    if (this_local == (ShaderVariableManagerGL *)0x0) {
      UVar1 = GetNumImages(this);
      this_local = (ShaderVariableManagerGL *)
                   ShaderVariableLocator::
                   TryResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>
                             ((ShaderVariableLocator *)&pUB,UVar1);
      if (this_local == (ShaderVariableManagerGL *)0x0) {
        UVar1 = GetNumStorageBuffers(this);
        this_local = (ShaderVariableManagerGL *)
                     ShaderVariableLocator::
                     TryResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                               ((ShaderVariableLocator *)&pUB,UVar1);
        if (this_local == (ShaderVariableManagerGL *)0x0) {
          LogError<false,unsigned_int,char[32]>
                    (false,"GetVariable",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                     ,0x20f,(uint *)&VarLocator.field_0xc,
                     (char (*) [32])" is not a valid variable index.");
          this_local = (ShaderVariableManagerGL *)0x0;
        }
      }
    }
  }
  return (IShaderResourceVariable *)this_local;
}

Assistant:

IShaderResourceVariable* ShaderVariableManagerGL::GetVariable(Uint32 Index) const
{
    ShaderVariableLocator VarLocator(*this, Index);

    if (auto* pUB = VarLocator.TryResource<UniformBuffBindInfo>(GetNumUBs()))
        return pUB;

    if (auto* pTexture = VarLocator.TryResource<TextureBindInfo>(GetNumTextures()))
        return pTexture;

    if (auto* pImage = VarLocator.TryResource<ImageBindInfo>(GetNumImages()))
        return pImage;

    if (auto* pSSBO = VarLocator.TryResource<StorageBufferBindInfo>(GetNumStorageBuffers()))
        return pSSBO;

    LOG_ERROR(Index, " is not a valid variable index.");
    return nullptr;
}